

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Facet.hpp
# Opt level: O0

bool planeBoxOverlap(Point<double> *normal,Point<double> *vert,Point<double> *maxbox)

{
  double dVar1;
  double *pdVar2;
  double dVar3;
  double v;
  undefined1 local_58 [4];
  int q;
  Point<double> vmax;
  Point<double> vmin;
  Point<double> *maxbox_local;
  Point<double> *vert_local;
  Point<double> *normal_local;
  
  for (v._4_4_ = 0; v._4_4_ < 3; v._4_4_ = v._4_4_ + 1) {
    pdVar2 = Parfait::Point<double>::operator[](vert,v._4_4_);
    dVar3 = *pdVar2;
    pdVar2 = Parfait::Point<double>::operator[](normal,v._4_4_);
    if (*pdVar2 <= 0.0) {
      pdVar2 = Parfait::Point<double>::operator[](maxbox,v._4_4_);
      dVar1 = *pdVar2;
      pdVar2 = Parfait::Point<double>::operator[]((Point<double> *)(vmax.pos._M_elems + 2),v._4_4_);
      *pdVar2 = dVar1 - dVar3;
      pdVar2 = Parfait::Point<double>::operator[](maxbox,v._4_4_);
      dVar1 = *pdVar2;
      pdVar2 = Parfait::Point<double>::operator[]((Point<double> *)local_58,v._4_4_);
      *pdVar2 = -dVar1 - dVar3;
    }
    else {
      pdVar2 = Parfait::Point<double>::operator[](maxbox,v._4_4_);
      dVar1 = *pdVar2;
      pdVar2 = Parfait::Point<double>::operator[]((Point<double> *)(vmax.pos._M_elems + 2),v._4_4_);
      *pdVar2 = -dVar1 - dVar3;
      pdVar2 = Parfait::Point<double>::operator[](maxbox,v._4_4_);
      dVar1 = *pdVar2;
      pdVar2 = Parfait::Point<double>::operator[]((Point<double> *)local_58,v._4_4_);
      *pdVar2 = dVar1 - dVar3;
    }
  }
  dVar3 = Parfait::Point<double>::dot(normal,(Point<double> *)(vmax.pos._M_elems + 2));
  if (dVar3 - 1e-10 <= 0.0) {
    dVar3 = Parfait::Point<double>::dot(normal,(Point<double> *)local_58);
    if (dVar3 + 1e-10 < 0.0) {
      normal_local._7_1_ = false;
    }
    else {
      normal_local._7_1_ = true;
    }
  }
  else {
    normal_local._7_1_ = false;
  }
  return normal_local._7_1_;
}

Assistant:

inline bool planeBoxOverlap(const Parfait::Point<double> &normal, const Parfait::Point<double> &vert,
                     const Parfait::Point<double> &maxbox) {
    Parfait::Point<double> vmin, vmax;
    for (int q = 0; q < 3; q++) {
        double v = vert[q];
        if (normal[q] > 0.0) { vmin[q] = -maxbox[q] - v;
            vmax[q] = maxbox[q] - v;
        } else {
            vmin[q] = maxbox[q] - v;
            vmax[q] = -maxbox[q] - v;
        }
    }
    if (Parfait::Point<double>::dot(normal, vmin) - TOL > 0.0) {
        return false;
    }
    if (Parfait::Point<double>::dot(normal, vmax) + TOL >= 0.0) {
        return true;
    }

    return false;
}